

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,true>
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> begin,
               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> end,
               int param_3,byte param_4)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  double __tmp;
  double dVar16;
  double dVar17;
  double __tmp_2;
  double dVar18;
  double __tmp_9;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
  pVar19;
  _Iter_comp_iter<std::less<double>_> __cmp;
  _Iter_comp_iter<std::less<double>_> __cmp_1;
  _Iter_comp_iter<std::less<double>_> local_36;
  _Iter_comp_iter<std::less<double>_> local_35;
  int local_34;
  
  uVar13 = (long)end._M_current - (long)begin._M_current >> 3;
  local_34 = param_3;
  if ((long)uVar13 < 0x18) {
    pdVar5 = begin._M_current;
    if (param_4 == 0) {
LAB_00289462:
      pdVar6 = pdVar5 + 1;
      if (pdVar5 + 1 == end._M_current || pdVar5 == end._M_current) {
        return;
      }
      do {
        pdVar7 = pdVar6;
        dVar16 = *pdVar5;
        dVar1 = pdVar5[1];
        pdVar5 = pdVar7;
        if (dVar1 < dVar16) {
          do {
            *pdVar5 = dVar16;
            dVar16 = pdVar5[-2];
            pdVar5 = pdVar5 + -1;
          } while (dVar1 < dVar16);
          *pdVar5 = dVar1;
        }
        pdVar6 = pdVar7 + 1;
        pdVar5 = pdVar7;
      } while (pdVar7 + 1 != end._M_current);
      return;
    }
  }
  else {
    do {
      uVar3 = uVar13 >> 1;
      if (uVar13 < 0x81) {
        dVar16 = *begin._M_current;
        dVar1 = begin._M_current[uVar3];
        if (dVar16 < dVar1) {
          begin._M_current[uVar3] = dVar16;
          *begin._M_current = dVar1;
          dVar16 = dVar1;
        }
        if (end._M_current[-1] < dVar16) {
          *begin._M_current = end._M_current[-1];
          end._M_current[-1] = dVar16;
          dVar16 = *begin._M_current;
        }
        dVar1 = begin._M_current[uVar3];
        if (dVar16 < dVar1) {
          begin._M_current[uVar3] = dVar16;
          *begin._M_current = dVar1;
        }
      }
      else {
        dVar16 = begin._M_current[uVar3];
        dVar1 = *begin._M_current;
        if (dVar16 < dVar1) {
          *begin._M_current = dVar16;
          begin._M_current[uVar3] = dVar1;
          dVar16 = dVar1;
        }
        if (end._M_current[-1] < dVar16) {
          begin._M_current[uVar3] = end._M_current[-1];
          end._M_current[-1] = dVar16;
          dVar16 = begin._M_current[uVar3];
        }
        dVar1 = *begin._M_current;
        if (dVar16 < dVar1) {
          *begin._M_current = dVar16;
          begin._M_current[uVar3] = dVar1;
        }
        dVar16 = begin._M_current[uVar3 - 1];
        dVar1 = begin._M_current[1];
        if (dVar16 < dVar1) {
          begin._M_current[1] = dVar16;
          begin._M_current[uVar3 - 1] = dVar1;
          dVar16 = dVar1;
        }
        if (end._M_current[-2] < dVar16) {
          begin._M_current[uVar3 - 1] = end._M_current[-2];
          end._M_current[-2] = dVar16;
          dVar16 = begin._M_current[uVar3 - 1];
        }
        dVar1 = begin._M_current[1];
        if (dVar16 < dVar1) {
          begin._M_current[1] = dVar16;
          begin._M_current[uVar3 - 1] = dVar1;
        }
        dVar16 = begin._M_current[uVar3 + 1];
        dVar1 = begin._M_current[2];
        if (dVar16 < dVar1) {
          begin._M_current[2] = dVar16;
          begin._M_current[uVar3 + 1] = dVar1;
          dVar16 = dVar1;
        }
        if (end._M_current[-3] < dVar16) {
          begin._M_current[uVar3 + 1] = end._M_current[-3];
          end._M_current[-3] = dVar16;
          dVar16 = begin._M_current[uVar3 + 1];
        }
        dVar1 = begin._M_current[2];
        if (dVar16 < dVar1) {
          begin._M_current[2] = dVar16;
          begin._M_current[uVar3 + 1] = dVar1;
          dVar16 = dVar1;
        }
        dVar1 = begin._M_current[uVar3 - 1];
        dVar17 = begin._M_current[uVar3];
        dVar18 = dVar1;
        if (dVar17 < dVar1) {
          begin._M_current[uVar3 - 1] = dVar17;
          begin._M_current[uVar3] = dVar1;
          dVar18 = dVar17;
          dVar17 = dVar1;
        }
        if (dVar16 < dVar17) {
          begin._M_current[uVar3] = dVar16;
          begin._M_current[uVar3 + 1] = dVar17;
          dVar17 = dVar16;
        }
        if (dVar17 < dVar18) {
          begin._M_current[uVar3 - 1] = dVar17;
          begin._M_current[uVar3] = dVar18;
          dVar17 = dVar18;
        }
        dVar1 = *begin._M_current;
        *begin._M_current = dVar17;
        begin._M_current[uVar3] = dVar1;
      }
      if (((param_4 & 1) != 0) ||
         (dVar1 = *begin._M_current, begin._M_current[-1] <= dVar1 && dVar1 != begin._M_current[-1])
         ) {
        pVar19 = partition_right_branchless<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
                           (begin._M_current,end._M_current);
        _Var4 = pVar19.first._M_current;
        uVar3 = (long)_Var4._M_current - (long)begin._M_current >> 3;
        pdVar5 = _Var4._M_current + 1;
        uVar15 = (long)end._M_current - (long)pdVar5 >> 3;
        if (((long)uVar3 < (long)(uVar13 >> 3)) || ((long)uVar15 < (long)(uVar13 >> 3))) {
          local_34 = local_34 + -1;
          if (local_34 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<double>>>
                      (begin,end,&local_36);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<double>>>
                      (begin,end,&local_35);
            return;
          }
          if (0x17 < (long)uVar3) {
            uVar13 = uVar3 >> 2;
            dVar1 = *begin._M_current;
            *begin._M_current = begin._M_current[uVar13];
            begin._M_current[uVar13] = dVar1;
            dVar1 = _Var4._M_current[-1];
            _Var4._M_current[-1] = _Var4._M_current[-uVar13];
            _Var4._M_current[-uVar13] = dVar1;
            if (0x80 < uVar3) {
              dVar1 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar13 + 1];
              begin._M_current[uVar13 + 1] = dVar1;
              dVar1 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar13 + 2];
              begin._M_current[uVar13 + 2] = dVar1;
              dVar1 = _Var4._M_current[-2];
              _Var4._M_current[-2] = _Var4._M_current[~uVar13];
              _Var4._M_current[~uVar13] = dVar1;
              dVar1 = _Var4._M_current[-3];
              _Var4._M_current[-3] = _Var4._M_current[-2 - uVar13];
              _Var4._M_current[-2 - uVar13] = dVar1;
            }
          }
          if (0x17 < (long)uVar15) {
            uVar13 = uVar15 >> 2;
            dVar1 = _Var4._M_current[1];
            _Var4._M_current[1] = _Var4._M_current[uVar13 + 1];
            _Var4._M_current[uVar13 + 1] = dVar1;
            dVar1 = end._M_current[-1];
            end._M_current[-1] = end._M_current[-uVar13];
            end._M_current[-uVar13] = dVar1;
            if (0x80 < uVar15) {
              dVar1 = _Var4._M_current[2];
              _Var4._M_current[2] = _Var4._M_current[uVar13 + 2];
              _Var4._M_current[uVar13 + 2] = dVar1;
              dVar1 = _Var4._M_current[3];
              _Var4._M_current[3] = _Var4._M_current[uVar13 + 3];
              _Var4._M_current[uVar13 + 3] = dVar1;
              dVar1 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar13];
              end._M_current[~uVar13] = dVar1;
              dVar1 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar13];
              end._M_current[-2 - uVar13] = dVar1;
            }
          }
        }
        else if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (begin._M_current + 1 != _Var4._M_current && begin._M_current != _Var4._M_current) {
            lVar2 = 8;
            uVar13 = 0;
            _Var9._M_current = begin._M_current;
            pdVar6 = begin._M_current + 1;
            do {
              dVar16 = *_Var9._M_current;
              dVar1 = _Var9._M_current[1];
              lVar8 = lVar2;
              if (dVar1 < dVar16) {
                do {
                  *(begin._M_current + lVar8) = dVar16;
                  _Var9._M_current = begin._M_current;
                  if (lVar8 == 8) goto LAB_00289136;
                  dVar16 = *(begin._M_current + lVar8 + -0x10);
                  lVar8 = lVar8 + -8;
                } while (dVar1 < dVar16);
                _Var9._M_current = lVar8 + begin._M_current;
LAB_00289136:
                *_Var9._M_current = dVar1;
                uVar13 = uVar13 + ((long)pdVar6 - (long)_Var9._M_current >> 3);
                if (8 < uVar13) goto LAB_002893bb;
              }
              pdVar7 = pdVar6 + 1;
              lVar2 = lVar2 + 8;
              _Var9._M_current = pdVar6;
              pdVar6 = pdVar7;
            } while (pdVar7 != _Var4._M_current);
          }
          if (pdVar5 == end._M_current) {
            return;
          }
          pdVar6 = _Var4._M_current + 2;
          if (pdVar6 == end._M_current) {
            return;
          }
          lVar2 = 0x10;
          lVar8 = 0;
          uVar13 = 0;
          pdVar7 = pdVar5;
          do {
            dVar16 = *pdVar7;
            pdVar7 = _Var4._M_current + lVar2;
            dVar1 = *(_Var4._M_current + lVar2);
            pdVar10 = pdVar6;
            lVar12 = lVar8;
            if (dVar1 < dVar16) {
              do {
                *pdVar10 = dVar16;
                pdVar11 = pdVar5;
                pdVar14 = pdVar5;
                if (lVar12 == 0) goto LAB_002891cb;
                dVar16 = pdVar10[-2];
                pdVar10 = pdVar10 + -1;
                lVar12 = lVar12 + 8;
              } while (dVar1 < dVar16);
              pdVar11 = pdVar10;
              pdVar14 = _Var4._M_current + (0x10 - lVar12);
LAB_002891cb:
              *pdVar11 = dVar1;
              uVar13 = uVar13 + ((long)pdVar7 - (long)pdVar14 >> 3);
              if (8 < uVar13) break;
            }
            lVar12 = lVar2 + 8;
            lVar2 = lVar2 + 8;
            pdVar6 = pdVar6 + 1;
            lVar8 = lVar8 + -8;
            if (_Var4._M_current + lVar12 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_002893bb:
        pdqsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,true>
                  (begin._M_current,_Var4._M_current,local_34,param_4 & 1);
        param_4 = 0;
        uVar13 = uVar15;
      }
      else {
        lVar2 = 0;
        do {
          dVar16 = *(end._M_current + lVar2 + -8);
          lVar2 = lVar2 + -8;
        } while (dVar1 < dVar16);
        pdVar5 = end._M_current + lVar2;
        _Var4._M_current = begin._M_current;
        dVar17 = dVar1;
        if (lVar2 == -8) {
          do {
            if (pdVar5 <= _Var4._M_current) break;
            _Var4._M_current = _Var4._M_current + 1;
            dVar17 = *_Var4._M_current;
          } while (dVar17 <= dVar1);
        }
        else {
          do {
            dVar17 = _Var4._M_current[1];
            _Var4._M_current = _Var4._M_current + 1;
          } while (dVar17 <= dVar1);
        }
        while (_Var4._M_current < pdVar5) {
          *_Var4._M_current = dVar16;
          *pdVar5 = dVar17;
          do {
            dVar16 = pdVar5[-1];
            pdVar5 = pdVar5 + -1;
          } while (dVar1 < dVar16);
          do {
            dVar17 = _Var4._M_current[1];
            _Var4._M_current = _Var4._M_current + 1;
          } while (dVar17 <= dVar1);
        }
        *begin._M_current = dVar16;
        *pdVar5 = dVar1;
        pdVar5 = pdVar5 + 1;
        uVar13 = (long)end._M_current - (long)pdVar5 >> 3;
      }
      begin._M_current = pdVar5;
    } while (0x17 < (long)uVar13);
    if ((param_4 & 1) == 0) goto LAB_00289462;
  }
  if (pdVar5 + 1 != end._M_current && pdVar5 != end._M_current) {
    lVar2 = 8;
    pdVar6 = pdVar5;
    pdVar7 = pdVar5 + 1;
    do {
      dVar16 = *pdVar6;
      dVar1 = pdVar6[1];
      lVar8 = lVar2;
      if (dVar1 < dVar16) {
        do {
          *(double *)((long)pdVar5 + lVar8) = dVar16;
          pdVar6 = pdVar5;
          if (lVar8 == 8) goto LAB_00288e64;
          dVar16 = *(double *)((long)pdVar5 + lVar8 + -0x10);
          lVar8 = lVar8 + -8;
        } while (dVar1 < dVar16);
        pdVar6 = (double *)(lVar8 + (long)pdVar5);
LAB_00288e64:
        *pdVar6 = dVar1;
      }
      pdVar10 = pdVar7 + 1;
      lVar2 = lVar2 + 8;
      pdVar6 = pdVar7;
      pdVar7 = pdVar10;
    } while (pdVar10 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }